

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsgdotspec(prscxdef *ctx,prsndef *n)

{
  ushort uVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  prpnum prop;
  prsndef *n1;
  prsndef *n0;
  ushort in_stack_ffffffffffffffde;
  ushort bytes;
  emtcxdef *ctx_00;
  
  ctx_00 = *(emtcxdef **)(in_RSI + 0x10);
  prsgexp(ctx,n);
  if ((*(int *)((long)&ctx_00->emtcxerr + 4) == 0) && (*(int *)&ctx_00->emtcxmem == 0x55)) {
    bytes = *(ushort *)&ctx_00->emtcxptr;
    emtres(ctx_00,bytes);
    lVar2 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
    *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
    *(undefined1 *)(lVar2 + (int)(uint)uVar1) = 0x13;
    emtres(ctx_00,bytes);
    oswp2((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                  (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),(uint)bytes);
    *(short *)(*(long *)(in_RDI + 0x28) + 0x12) = *(short *)(*(long *)(in_RDI + 0x28) + 0x12) + 2;
  }
  else {
    prsgexp(ctx,n);
    emtres(ctx_00,in_stack_ffffffffffffffde);
    lVar2 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
    *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
    *(undefined1 *)(lVar2 + (int)(uint)uVar1) = 0x15;
  }
  return;
}

Assistant:

static void prsgdotspec(prscxdef *ctx, prsndef *n)
{
    prsndef *n0 = n->prsnv.prsnvn[0];
    prsndef *n1 = n->prsnv.prsnvn[1];

    /* push object whose property we're getting */
    prsgexp(ctx, n0);

    if (n1->prsnnlf == 0
        && n1->prsnv.prsnvt.toktyp == TOKTPOUND)
    {
        /* RHS is a property symbol - do a simple GETP (or INHERIT) */
        prpnum prop = n1->prsnv.prsnvt.tokofs;

        /* push the data property */
        emtop(ctx->prscxemt, OPCGETPDATA);
        emtint2(ctx->prscxemt, prop);
    }
    else
    {
        /* RHS is an expression - evaluate it */
        prsgexp(ctx, n1);

        /* get the data property */
        emtop(ctx->prscxemt, OPCPTRGETPDATA);
    }
}